

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2_pack16.h
# Opt level: O1

void ncnn::pooling2x2s2_max_pack16_avx512(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 (*pauVar4) [64];
  int iVar5;
  long lVar6;
  long lVar7;
  undefined1 (*pauVar8) [64];
  undefined1 (*pauVar9) [64];
  int iVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    iVar2 = top_blob->w;
    iVar3 = top_blob->h;
    lVar6 = (long)((bottom_blob->w - iVar2) * 0x20);
    lVar7 = 0;
    do {
      if (0 < iVar3) {
        pauVar8 = (undefined1 (*) [64])
                  (bottom_blob->cstep * lVar7 * bottom_blob->elemsize + (long)bottom_blob->data);
        pauVar4 = (undefined1 (*) [64])(*pauVar8 + (long)bottom_blob->w * bottom_blob->elemsize);
        pauVar9 = (undefined1 (*) [64])
                  (top_blob->cstep * lVar7 * top_blob->elemsize + (long)top_blob->data);
        iVar5 = 0;
        do {
          iVar10 = iVar2;
          if (0 < iVar2) {
            do {
              auVar11 = vmaxps_avx512f(*pauVar8,pauVar8[1]);
              auVar12 = vmaxps_avx512f(*pauVar4,pauVar4[1]);
              auVar11 = vmaxps_avx512f(auVar11,auVar12);
              *pauVar9 = auVar11;
              pauVar8 = pauVar8 + 2;
              pauVar4 = pauVar4 + 2;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          pauVar8 = (undefined1 (*) [64])(*pauVar8 + lVar6 * 4);
          pauVar4 = (undefined1 (*) [64])(*pauVar4 + lVar6 * 4);
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

static void pooling2x2s2_max_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 16;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);

                __m512 _max0 = _mm512_max_ps(_r00, _r01);
                __m512 _max1 = _mm512_max_ps(_r10, _r11);
                __m512 _max = _mm512_max_ps(_max0, _max1);

                _mm512_storeu_ps(outptr, _max);

                r0 += 32;
                r1 += 32;
                outptr += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
        }
    }
}